

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Flate.cc
# Opt level: O3

void __thiscall Pl_Flate::finish_zopfli(Pl_Flate *this)

{
  return;
}

Assistant:

void
Pl_Flate::finish_zopfli()
{
#ifdef ZOPFLI
    if (!m->zopfli_buf) {
        return;
    }
    auto buf = std::move(*m->zopfli_buf.release());
    ZopfliOptions z_opt;
    ZopfliInitOptions(&z_opt);
    unsigned char* out{nullptr};
    size_t out_size{0};
    ZopfliCompress(
        &z_opt,
        ZOPFLI_FORMAT_ZLIB,
        reinterpret_cast<unsigned char const*>(buf.c_str()),
        buf.size(),
        &out,
        &out_size);
    std::unique_ptr<unsigned char, decltype(&free)> p(out, &free);
    next()->write(out, out_size);
    // next()->finish is called by finish()
#endif
}